

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_set.cc
# Opt level: O0

void __thiscall sfm::FeatureSet::compute_surf(FeatureSet *this,ConstPtr *image)

{
  pointer *this_00;
  float x;
  float y;
  Descriptor *pDVar1;
  size_t sVar2;
  Descriptors *__x;
  size_type sVar3;
  size_type sVar4;
  Descriptor *pDVar5;
  reference this_01;
  element_type *this_02;
  reference this_03;
  uchar *px;
  Vector<float,_2> local_e0;
  reference local_d8;
  Descriptor *d;
  size_t i;
  size_t offset;
  __normal_iterator<features::Surf::Descriptor_*,_std::vector<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>_>
  local_b8;
  shared_ptr<const_core::Image<unsigned_char>_> local_b0 [2];
  undefined1 local_90 [8];
  Surf surf;
  Descriptors descr;
  ConstPtr *image_local;
  FeatureSet *this_local;
  
  std::vector<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>::vector
            ((vector<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_> *)
             &surf.descriptors.
              super__Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  features::Surf::Surf((Surf *)local_90,&(this->opts).surf_opts);
  std::shared_ptr<const_core::Image<unsigned_char>_>::shared_ptr(local_b0,image);
  features::Surf::set_image((Surf *)local_90,local_b0);
  std::shared_ptr<const_core::Image<unsigned_char>_>::~shared_ptr(local_b0);
  features::Surf::process((Surf *)local_90);
  __x = features::Surf::get_descriptors((Surf *)local_90);
  std::vector<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>::operator=
            ((vector<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_> *)
             &surf.descriptors.
              super__Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,__x);
  features::Surf::~Surf((Surf *)local_90);
  this_00 = &surf.descriptors.
             super__Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_b8._M_current =
       (Descriptor *)
       std::vector<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>::begin
                 ((vector<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_> *
                  )this_00);
  offset = (size_t)std::
                   vector<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>::
                   end((vector<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>
                        *)this_00);
  std::
  sort<__gnu_cxx::__normal_iterator<features::Surf::Descriptor*,std::vector<features::Surf::Descriptor,std::allocator<features::Surf::Descriptor>>>,bool(*)(features::Surf::Descriptor_const&,features::Surf::Descriptor_const&)>
            (local_b8,(__normal_iterator<features::Surf::Descriptor_*,_std::vector<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>_>
                       )offset,anon_unknown_1::compare_scale<features::Surf::Descriptor>);
  sVar3 = std::vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>::size
                    (&this->positions);
  i = sVar3;
  sVar4 = std::vector<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>::size
                    ((vector<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>
                      *)&surf.descriptors.
                         super__Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>::resize
            (&this->positions,sVar3 + sVar4);
  sVar2 = i;
  sVar3 = std::vector<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>::size
                    ((vector<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>
                      *)&surf.descriptors.
                         super__Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<math::Vector<unsigned_char,_3>,_std::allocator<math::Vector<unsigned_char,_3>_>_>::
  resize(&this->colors,sVar2 + sVar3);
  d = (Descriptor *)0x0;
  while( true ) {
    pDVar1 = d;
    pDVar5 = (Descriptor *)
             std::vector<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>::
             size((vector<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_> *
                  )&surf.descriptors.
                    super__Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (pDVar5 <= pDVar1) break;
    local_d8 = std::vector<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>
               ::operator[]((vector<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>
                             *)&surf.descriptors.
                                super__Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)d);
    math::Vector<float,_2>::Vector(&local_e0,&local_d8->x,&local_d8->y);
    this_01 = std::vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>::
              operator[](&this->positions,(long)(d->data).v + (i - 0x10));
    math::Vector<float,_2>::operator=(this_01,&local_e0);
    this_02 = std::
              __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)image);
    x = local_d8->x;
    y = local_d8->y;
    this_03 = std::
              vector<math::Vector<unsigned_char,_3>,_std::allocator<math::Vector<unsigned_char,_3>_>_>
              ::operator[](&this->colors,(long)(d->data).v + (i - 0x10));
    px = math::Vector<unsigned_char,_3>::begin(this_03);
    core::Image<unsigned_char>::linear_at(this_02,x,y,px);
    d = (Descriptor *)((long)&d->x + 1);
  }
  std::swap<features::Surf::Descriptor,std::allocator<features::Surf::Descriptor>>
            ((vector<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_> *)
             &surf.descriptors.
              super__Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&this->surf_descriptors);
  std::vector<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>::~vector
            ((vector<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_> *)
             &surf.descriptors.
              super__Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void
FeatureSet::compute_surf (core::ByteImage::ConstPtr image)
{
    /* Compute features. */
    Surf::Descriptors descr;
    {
        Surf surf(this->opts.surf_opts);
        surf.set_image(image);
        surf.process();
        descr = surf.get_descriptors();
    }

    /* Sort features by scale for low-res matching. */
    std::sort(descr.begin(), descr.end(), compare_scale<sfm::Surf::Descriptor>);

    /* Prepare and copy to data structures. */
    std::size_t offset = this->positions.size();
    this->positions.resize(offset + descr.size());
    this->colors.resize(offset + descr.size());

    for (std::size_t i = 0; i < descr.size(); ++i)
    {
        Surf::Descriptor const& d = descr[i];
        this->positions[offset + i] = math::Vec2f(d.x, d.y);
        image->linear_at(d.x, d.y, this->colors[offset + i].begin());
    }

    /* Keep SURF descriptors. */
    std::swap(descr, this->surf_descriptors);
}